

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O0

BOOL __thiscall
Js::DictionaryTypeHandlerBase<unsigned_short>::SetItem
          (DictionaryTypeHandlerBase<unsigned_short> *this,DynamicObject *instance,uint32 index,
          Var value,PropertyOperationFlags flags)

{
  byte bVar1;
  bool bVar2;
  BOOL BVar3;
  ScriptContext *scriptContext_00;
  ScriptContext *scriptContext;
  PropertyOperationFlags flags_local;
  Var value_local;
  uint32 index_local;
  DynamicObject *instance_local;
  DictionaryTypeHandlerBase<unsigned_short> *this_local;
  
  bVar1 = DynamicTypeHandler::GetFlags(&this->super_DynamicTypeHandler);
  if (((bVar1 & 1) == 0) && (bVar2 = DynamicObject::HasObjectArray(instance), !bVar2)) {
    scriptContext_00 = RecyclableObject::GetScriptContext(&instance->super_RecyclableObject);
    JavascriptError::ThrowCantExtendIfStrictMode(flags,scriptContext_00);
    return 0;
  }
  BVar3 = DynamicTypeHandler::SetItem(&this->super_DynamicTypeHandler,instance,index,value,flags);
  return BVar3;
}

Assistant:

BOOL DictionaryTypeHandlerBase<T>::SetItem(DynamicObject* instance, uint32 index, Var value, PropertyOperationFlags flags)
    {
        if (!(this->GetFlags() & IsExtensibleFlag) && !instance->HasObjectArray())
        {
            ScriptContext* scriptContext = instance->GetScriptContext();
            JavascriptError::ThrowCantExtendIfStrictMode(flags, scriptContext);
            return false;
        }
        return __super::SetItem(instance, index, value, flags);
    }